

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# master.hpp
# Opt level: O0

void __thiscall
diy::Master::foreach<diy::detail::ReductionFunctor<void,diy::RegularSwapPartners>>
          (Master *this,ReductionFunctor<void,_diy::RegularSwapPartners> *f,Skip *s)

{
  Skip *in_stack_00000060;
  Callback<void> *in_stack_00000068;
  Master *in_stack_00000070;
  ReductionFunctor<void,_diy::RegularSwapPartners> *in_stack_ffffffffffffffb8;
  function<void_(void_*,_const_diy::Master::ProxyWithLink_&)> *in_stack_ffffffffffffffc0;
  
  std::function<void(void*,diy::Master::ProxyWithLink_const&)>::
  function<diy::detail::ReductionFunctor<void,diy::RegularSwapPartners>const&,void>
            (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  foreach_<void>(in_stack_00000070,in_stack_00000068,in_stack_00000060);
  Catch::clara::std::function<void_(void_*,_const_diy::Master::ProxyWithLink_&)>::~function
            ((function<void_(void_*,_const_diy::Master::ProxyWithLink_&)> *)0x20c3cf);
  return;
}

Assistant:

void          foreach(const F& f, const Skip& s = NeverSkip())
      {
          using Block = typename detail::block_traits<F>::type;
          foreach_<Block>(f, s);
      }